

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O2

int jsfdigit(uint a,uint b)

{
  uint uVar1;
  
  uVar1 = a & 3;
  if (uVar1 == 0) {
    return 0;
  }
  if ((((a & 7) == 5) || ((a & 7) == 3)) && ((b & 3) == 2)) {
    return uVar1 - 2;
  }
  return 2 - uVar1;
}

Assistant:

static int
jsfdigit(unsigned int a, unsigned int b)
{
	int u = 2 - (a & 0x03);
	if (u == 2)
		return 0;
	if ( ((a & 0x07) == 3 || (a & 0x07) == 5) && (b & 0x03) == 2 )
		return -u;
	return u;
}